

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
Number_N10ExplicitBase10_Test<char>::TestBody(Number_N10ExplicitBase10_Test<char> *this)

{
  bool bVar1;
  char *message;
  size_t in_RCX;
  void *__buf;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __string_type *actual;
  undefined1 local_28 [8];
  number_long v;
  Number_N10ExplicitBase10_Test<char> *this_local;
  
  v.v_ = (longlong)this;
  pstore::dump::number_long::number_long((number_long *)local_28,10,10);
  pstore::dump::value::write((value *)local_28,(int)this + 0x10,__buf,in_RCX);
  std::__cxx11::ostringstream::str();
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expected;
  convert<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &gtest_ar.message_,"10");
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_98,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
               ,100,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expected);
  pstore::dump::number_long::~number_long((number_long *)local_28);
  return;
}

Assistant:

TYPED_TEST (Number, N10ExplicitBase10) {
    pstore::dump::number_long v (10, 10);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("10");
    EXPECT_EQ (expected, actual);
}